

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uc.c
# Opt level: O2

uc_err uc_mem_protect(uc_struct *uc,uint64_t address,size_t size,uint32_t perms)

{
  _Bool _Var1;
  uc_err uVar2;
  MemoryRegion *pMVar3;
  size_t size_00;
  ulong uVar4;
  byte bVar5;
  uint64_t uVar6;
  
  if (((uc->init_done != false) || (uVar2 = uc_init_engine(uc), uVar2 == UC_ERR_OK)) &&
     (uVar2 = UC_ERR_ARG, uc->snapshot_level < 1)) {
    if (size == 0) {
      uVar2 = UC_ERR_OK;
    }
    else if ((perms < 8) && ((((uint)size | (uint)address) & uc->target_page_align) == 0)) {
      _Var1 = check_mem_area(uc,address,size);
      uVar2 = UC_ERR_NOMEM;
      if (_Var1) {
        bVar5 = 0;
        uVar6 = address;
        for (uVar4 = 0; uVar4 <= size && size - uVar4 != 0; uVar4 = uVar4 + size_00) {
          pMVar3 = (*uc->memory_mapping)(uc,uVar6);
          size_00 = memory_region_len(uc,pMVar3,uVar6,size - uVar4);
          if (pMVar3->ram == true) {
            _Var1 = split_region(uc,pMVar3,uVar6,size_00,false);
            if (!_Var1) {
              return UC_ERR_NOMEM;
            }
            pMVar3 = (*uc->memory_mapping)(uc,uVar6);
            bVar5 = (byte)((pMVar3->perms & 4) >> 2) & perms < 4 | bVar5;
            pMVar3->perms = perms;
            (*uc->readonly_mem)(pMVar3,(perms & 2) == 0);
          }
          else {
            _Var1 = split_mmio_region(uc,pMVar3,uVar6,size_00,false);
            if (!_Var1) {
              return UC_ERR_NOMEM;
            }
            pMVar3 = (*uc->memory_mapping)(uc,uVar6);
            pMVar3->perms = perms;
          }
          uVar6 = uVar6 + size_00;
        }
        uVar2 = UC_ERR_OK;
        if ((bVar5 != 0) && (uVar6 = (*uc->get_pc)(uc), address <= uVar6 && uVar6 < size + address))
        {
          uc->quit_request = true;
          uc_emu_stop(uc);
        }
      }
    }
  }
  return uVar2;
}

Assistant:

UNICORN_EXPORT
uc_err uc_mem_protect(struct uc_struct *uc, uint64_t address, size_t size,
                      uint32_t perms)
{
    MemoryRegion *mr;
    uint64_t addr = address;
    uint64_t pc;
    size_t count, len;
    bool remove_exec = false;

    UC_INIT(uc);

    // snapshot and protection can't be mixed
    if (uc->snapshot_level > 0) {
        return UC_ERR_ARG;
    }

    if (size == 0) {
        // trivial case, no change
        return UC_ERR_OK;
    }

    // address must be aligned to uc->target_page_size
    if ((address & uc->target_page_align) != 0) {
        return UC_ERR_ARG;
    }

    // size must be multiple of uc->target_page_size
    if ((size & uc->target_page_align) != 0) {
        return UC_ERR_ARG;
    }

    // check for only valid permissions
    if ((perms & ~UC_PROT_ALL) != 0) {
        return UC_ERR_ARG;
    }

    // check that user's entire requested block is mapped
    // TODO check if protected is possible
    // deny after cow
    if (!check_mem_area(uc, address, size)) {
        return UC_ERR_NOMEM;
    }

    // Now we know entire region is mapped, so change permissions
    // We may need to split regions if this area spans adjacent regions
    addr = address;
    count = 0;
    while (count < size) {
        mr = uc->memory_mapping(uc, addr);
        len = memory_region_len(uc, mr, addr, size - count);
        if (mr->ram) {
            if (!split_region(uc, mr, addr, len, false)) {
                return UC_ERR_NOMEM;
            }

            mr = uc->memory_mapping(uc, addr);
            // will this remove EXEC permission?
            if (((mr->perms & UC_PROT_EXEC) != 0) &&
                ((perms & UC_PROT_EXEC) == 0)) {
                remove_exec = true;
            }
            mr->perms = perms;
            uc->readonly_mem(mr, (perms & UC_PROT_WRITE) == 0);

        } else {
            if (!split_mmio_region(uc, mr, addr, len, false)) {
                return UC_ERR_NOMEM;
            }

            mr = uc->memory_mapping(uc, addr);
            mr->perms = perms;
        }

        count += len;
        addr += len;
    }

    // if EXEC permission is removed, then quit TB and continue at the same
    // place
    if (remove_exec) {
        pc = uc->get_pc(uc);
        if (pc < address + size && pc >= address) {
            uc->quit_request = true;
            uc_emu_stop(uc);
        }
    }

    return UC_ERR_OK;
}